

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O2

bool __thiscall spv::Builder::isIntType(Builder *this,Id typeId)

{
  Instruction *this_00;
  uint uVar1;
  
  this_00 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start[typeId];
  if (this_00->opCode == OpTypeInt) {
    uVar1 = Instruction::getImmediateOperand(this_00,1);
    return uVar1 != 0;
  }
  return false;
}

Assistant:

Instruction* getInstruction(Id id) const { return idToInstruction[id]; }